

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)

{
  long lVar1;
  CPUID2CacheDescriptorInfo *d;
  int i;
  CPUCacheInfo *cache_local;
  
  if (cache->size == 0) {
    __assert_fail("cache->size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbc,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->level == '\0') {
    __assert_fail("cache->level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbd,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->line_size == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbe,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->associativity != '\0') {
    d._4_4_ = 0;
    while( true ) {
      if (0xec < d._4_4_) {
        return 0xff;
      }
      lVar1 = (long)(int)d._4_4_;
      if ((((cpuid2_cache_descriptors[lVar1].level == (uint)cache->level) &&
           (cpuid2_cache_descriptors[lVar1].type == cache->type)) &&
          (cpuid2_cache_descriptors[lVar1].size == cache->size)) &&
         ((cpuid2_cache_descriptors[lVar1].line_size == (uint)cache->line_size &&
          (cpuid2_cache_descriptors[lVar1].associativity == (uint)cache->associativity)))) break;
      d._4_4_ = d._4_4_ + 1;
    }
    return (uint8_t)d._4_4_;
  }
  __assert_fail("cache->associativity > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                ,0xbf,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
}

Assistant:

static uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)
{
    int i;

    assert(cache->size > 0);
    assert(cache->level > 0);
    assert(cache->line_size > 0);
    assert(cache->associativity > 0);
    for (i = 0; i < ARRAY_SIZE(cpuid2_cache_descriptors); i++) {
        struct CPUID2CacheDescriptorInfo *d = &cpuid2_cache_descriptors[i];
        if (d->level == cache->level && d->type == cache->type &&
            d->size == cache->size && d->line_size == cache->line_size &&
            d->associativity == cache->associativity) {
                return i;
            }
    }

    return CACHE_DESCRIPTOR_UNAVAILABLE;
}